

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

void __thiscall
Clasp::DefaultUnfoundedCheck::updateSource(DefaultUnfoundedCheck *this,AtomData *atom,BodyPtr *n)

{
  uint uVar1;
  pointer pBVar2;
  AtomData AVar3;
  ulong uVar4;
  
  AVar3 = *atom;
  uVar4 = (ulong)(uint)AVar3 & 0x1fffffff;
  if (uVar4 != 0x1fffffff) {
    pBVar2 = (this->bodies_).ebo_.buf;
    uVar1 = *(uint *)(pBVar2 + uVar4);
    *(uint *)(pBVar2 + uVar4) = uVar1 & 0x80000000 | uVar1 - 1 & 0x7fffffff;
    AVar3 = *atom;
  }
  *atom = (AtomData)((uint)AVar3 & 0x60000000 | n->id & 0x1fffffff | 0x80000000);
  pBVar2 = (this->bodies_).ebo_.buf;
  uVar1 = *(uint *)(pBVar2 + n->id);
  *(uint *)(pBVar2 + n->id) = uVar1 & 0x80000000 | uVar1 + 1 & 0x7fffffff;
  return;
}

Assistant:

void DefaultUnfoundedCheck::updateSource(AtomData& atom, const BodyPtr& n) {
	if (atom.watch() != AtomData::nill_source) {
		--bodies_[atom.watch()].watches;
	}
	atom.setSource(n.id);
	++bodies_[n.id].watches;
}